

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O1

BrotliDecoderErrorCode
duckdb_brotli::ReadHuffmanCode
          (uint64_t alphabet_size_max,uint64_t alphabet_size_limit,HuffmanCode *table,
          uint64_t *opt_table_size,BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br_00;
  uint8_t *code_lengths;
  long lVar1;
  uint16_t *puVar2;
  short *psVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  short sVar7;
  ushort uVar8;
  byte *pbVar9;
  uint16_t *puVar10;
  uint *puVar11;
  uint *puVar12;
  BrotliDecoderErrorCode BVar13;
  uint uVar14;
  int iVar15;
  uint64_t available_bits;
  ulong uVar16;
  char cVar17;
  sbyte sVar18;
  BrotliRunningHuffmanState BVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint64_t uVar25;
  bool bVar26;
  ulong uVar27;
  uint64_t *puVar28;
  uint64_t uVar29;
  byte *pbVar30;
  ulong unaff_R12;
  uint64_t uVar31;
  long lVar32;
  uint64_t uVar33;
  bool bVar34;
  BrotliBitReader *br;
  ulong local_40;
  
  br_00 = &s->br;
  code_lengths = (s->arena).header.code_length_code_lengths;
  uVar16 = (ulong)(s->arena).header.substate_huffman;
  while (iVar15 = (int)uVar16, iVar15 == 0) {
    uVar20 = (s->br).bit_pos_;
    uVar16 = CONCAT71((int7)(uVar16 >> 8),uVar20 < 2);
    if (uVar20 < 2) {
      pbVar30 = (s->br).next_in;
      if (pbVar30 != (s->br).last_in) {
        (s->br).val_ = (s->br).val_ | (ulong)*pbVar30 << ((byte)uVar20 & 0x3f);
        uVar20 = uVar20 | 8;
        (s->br).bit_pos_ = uVar20;
        (s->br).next_in = pbVar30 + 1;
        uVar16 = 0;
        goto LAB_0032f564;
      }
    }
    else {
LAB_0032f564:
      uVar27 = (s->br).val_;
      *(ulong *)((long)&s->arena + 0x10) = (ulong)((uint)uVar27 & 3);
      (s->br).bit_pos_ = uVar20 - 2;
      (s->br).val_ = uVar27 >> 2;
    }
    if ((char)uVar16 != '\0') {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if ((s->arena).header.sub_loop_counter == 1) goto switchD_0032f5e4_caseD_1;
    (s->arena).header.space = 0x20;
    (s->arena).header.repeat = 0;
    *(undefined1 (*) [16])((long)&s->arena + 0x6f6) = (undefined1  [16])0x0;
    code_lengths[0] = '\0';
    code_lengths[1] = '\0';
    code_lengths[2] = '\0';
    code_lengths[3] = '\0';
    code_lengths[4] = '\0';
    code_lengths[5] = '\0';
    code_lengths[6] = '\0';
    code_lengths[7] = '\0';
    code_lengths[8] = '\0';
    code_lengths[9] = '\0';
    code_lengths[10] = '\0';
    code_lengths[0xb] = '\0';
    code_lengths[0xc] = '\0';
    code_lengths[0xd] = '\0';
    code_lengths[0xe] = '\0';
    code_lengths[0xf] = '\0';
    (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
    uVar16 = 4;
  }
  if (4 < iVar15 - 1U) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  uVar16 = (long)&switchD_0032f5e4::switchdataD_0043338c +
           (long)(int)(&switchD_0032f5e4::switchdataD_0043338c)[iVar15 - 1U];
  switch(iVar15) {
  case 1:
switchD_0032f5e4_caseD_1:
    uVar20 = (s->br).bit_pos_;
    uVar16 = CONCAT71((int7)(uVar16 >> 8),uVar20 < 2);
    if (uVar20 < 2) {
      pbVar30 = (s->br).next_in;
      if (pbVar30 != (s->br).last_in) {
        (s->br).val_ = (s->br).val_ | (ulong)*pbVar30 << ((byte)uVar20 & 0x3f);
        uVar20 = uVar20 | 8;
        (s->br).bit_pos_ = uVar20;
        (s->br).next_in = pbVar30 + 1;
        uVar16 = 0;
        goto LAB_0032f618;
      }
    }
    else {
LAB_0032f618:
      uVar27 = (s->br).val_;
      *(ulong *)((long)&s->arena + 0x28) = (ulong)((uint)uVar27 & 3);
      (s->br).bit_pos_ = uVar20 - 2;
      (s->br).val_ = uVar27 >> 2;
    }
    if ((char)uVar16 != '\0') {
      BVar13 = BROTLI_DECODER_NEEDS_MORE_INPUT;
      BVar19 = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
      goto LAB_0032f9e1;
    }
    (s->arena).header.sub_loop_counter = 0;
  case 2:
    uVar27 = alphabet_size_max - 1;
    uVar20 = 0x3f;
    if (uVar27 != 0) {
      for (; uVar27 >> uVar20 == 0; uVar20 = uVar20 - 1) {
      }
    }
    uVar20 = (uVar20 ^ 0xffffffffffffffc0) + 0x41;
    if (uVar27 == 0) {
      uVar20 = 0;
    }
    alphabet_size_max = (s->arena).header.sub_loop_counter;
    uVar27 = (s->arena).header.symbol;
    puVar28 = opt_table_size;
    do {
      if (uVar27 < alphabet_size_max) {
        lVar22 = 0x20e;
        uVar20 = 0;
        alphabet_size_max = uVar16 & 0xffffffff;
        goto LAB_0032f8ba;
      }
      uVar21 = (s->br).bit_pos_;
      bVar34 = uVar21 < uVar20;
      uVar24 = uVar21;
      if (bVar34) {
        pbVar30 = (s->br).next_in;
        pbVar9 = (s->br).last_in;
        if (pbVar30 == pbVar9) {
          bVar34 = true;
        }
        else {
          uVar33 = br_00->val_;
          do {
            uVar33 = (ulong)*pbVar30 << ((byte)uVar21 & 0x3f) | uVar33;
            (s->br).val_ = uVar33;
            uVar24 = uVar21 + 8;
            (s->br).bit_pos_ = uVar24;
            pbVar30 = pbVar30 + 1;
            (s->br).next_in = pbVar30;
            bVar34 = uVar24 < uVar20;
            if (!bVar34) goto LAB_0032f850;
            uVar21 = uVar21 + 8;
          } while (pbVar30 != pbVar9);
        }
      }
      else {
LAB_0032f850:
        uVar21 = (s->br).val_;
        puVar28 = (uint64_t *)(*(ulong *)(kBrotliBitMask + uVar20 * 8) & uVar21);
        (s->br).bit_pos_ = uVar24 - uVar20;
        (s->br).val_ = uVar21 >> ((byte)uVar20 & 0x3f);
      }
      if (bVar34) {
        (s->arena).header.sub_loop_counter = alphabet_size_max;
        (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
        uVar16 = 2;
LAB_0032f88a:
        bVar34 = false;
      }
      else {
        if (alphabet_size_limit <= puVar28) {
          uVar16 = 0xfffffffc;
          goto LAB_0032f88a;
        }
        *(short *)((long)&s->arena + alphabet_size_max * 2 + 200) = (short)puVar28;
        alphabet_size_max = alphabet_size_max + 1;
        bVar34 = true;
      }
    } while (bVar34);
    break;
  case 3:
    goto LAB_0032f932;
  case 4:
    uVar16 = (s->arena).header.sub_loop_counter;
    uVar33 = (s->arena).header.repeat;
    uVar31 = (s->arena).header.space;
    if (uVar16 < 0x12) {
      uVar20 = (s->br).bit_pos_;
      do {
        bVar4 = kCodeLengthCodeOrder[uVar16];
        bVar34 = uVar20 < 4;
        if (bVar34) {
          pbVar30 = (s->br).next_in;
          if (pbVar30 != (s->br).last_in) {
            (s->br).val_ = (s->br).val_ | (ulong)*pbVar30 << ((byte)uVar20 & 0x3f);
            uVar20 = uVar20 | 8;
            (s->br).bit_pos_ = uVar20;
            (s->br).next_in = pbVar30 + 1;
            bVar34 = false;
            goto LAB_0032f6cf;
          }
          bVar34 = true;
        }
        else {
LAB_0032f6cf:
          unaff_R12 = (ulong)((uint)br_00->val_ & 0xf);
        }
        if (bVar34) {
          if (uVar20 == 0) {
            unaff_R12 = 0;
          }
          else {
            unaff_R12 = (ulong)((uint)br_00->val_ & 0xf);
          }
          if ((byte)(&kCodeLengthPrefixLength)[unaff_R12] <= uVar20) goto LAB_0032f6df;
          (s->arena).header.sub_loop_counter = uVar16;
          (s->arena).header.repeat = uVar33;
          (s->arena).header.space = uVar31;
          (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
          cVar17 = '\x01';
        }
        else {
LAB_0032f6df:
          bVar5 = kCodeLengthPrefixValue[unaff_R12];
          bVar6 = (&kCodeLengthPrefixLength)[unaff_R12];
          uVar20 = uVar20 - bVar6;
          (s->br).bit_pos_ = uVar20;
          (s->br).val_ = (s->br).val_ >> (bVar6 & 0x3f);
          *(byte *)((long)&s->arena + (ulong)bVar4 + 0x6e8) = bVar5;
          cVar17 = '\0';
          if ((0x1111UL >> (unaff_R12 & 0x3f) & 1) == 0) {
            uVar31 = uVar31 - (0x20 >> (bVar5 & 0x1f));
            uVar33 = uVar33 + 1;
            psVar3 = (short *)((long)&s->arena + (ulong)bVar5 * 2 + 0x6fa);
            *psVar3 = *psVar3 + 1;
            cVar17 = (uVar31 - 0x21 < 0xffffffffffffffe0) * '\x02';
          }
        }
        if (cVar17 != '\0') {
          if (cVar17 != '\x02') {
            BVar13 = BROTLI_DECODER_NEEDS_MORE_INPUT;
            goto LAB_0032fa0c;
          }
          break;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x12);
    }
    BVar13 = BROTLI_DECODER_ERROR_FORMAT_CL_SPACE;
    if (uVar31 == 0) {
      BVar13 = BROTLI_DECODER_SUCCESS;
    }
    if (uVar33 == 1) {
      BVar13 = BROTLI_DECODER_SUCCESS;
    }
LAB_0032fa0c:
    if (BVar13 != BROTLI_DECODER_SUCCESS) {
      return BVar13;
    }
    BrotliBuildCodeLengthsHuffmanTable
              ((s->arena).header.table,code_lengths,(s->arena).header.code_length_histo);
    *(undefined1 (*) [16])((long)&s->arena + 0x70a) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&s->arena + 0x6fa) = (undefined1  [16])0x0;
    puVar10 = (s->arena).header.symbol_lists;
    lVar22 = 0;
    do {
      uVar14 = (uint)lVar22;
      puVar11 = (uint *)((long)&s->arena + lVar22 * 4 + 0x668);
      *puVar11 = uVar14 | 0xfffffff0;
      puVar11[1] = uVar14 | 0xfffffff1;
      puVar11[2] = uVar14 | 0xfffffff2;
      puVar11[3] = uVar14 | 0xfffffff3;
      puVar2 = puVar10 + (int)(uVar14 | 0xfffffff0);
      puVar2[0] = 0xffff;
      puVar2[1] = 0xffff;
      puVar2[2] = 0xffff;
      puVar2[3] = 0xffff;
      lVar22 = lVar22 + 4;
    } while (lVar22 != 0x10);
    *(undefined1 (*) [16])((long)&s->arena + 0x28) = (undefined1  [16])0x0;
    (s->arena).header.prev_code_len = 8;
    (s->arena).header.repeat_code_len = 0;
    (s->arena).header.space = 0x8000;
    (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
  case 5:
    uVar16 = (s->arena).header.symbol;
    uVar33 = (s->arena).header.repeat;
    uVar31 = (s->arena).header.space;
    uVar20 = (s->arena).header.repeat_code_len;
    local_40 = (s->arena).header.prev_code_len;
    puVar10 = (s->arena).header.symbol_lists;
    iVar15 = BrotliWarmupBitReader(br_00);
    BVar13 = BROTLI_DECODER_NEEDS_MORE_INPUT;
    if (iVar15 != 0) {
      do {
        if ((alphabet_size_limit <= uVar16) || (uVar31 == 0)) {
          (s->arena).header.space = uVar31;
          BVar13 = BROTLI_DECODER_SUCCESS;
          bVar34 = false;
          goto LAB_0032fcf3;
        }
        puVar11 = (uint *)(s->br).next_in;
        puVar12 = (uint *)(s->br).guard_in;
        uVar27 = uVar20;
        if (puVar11 < puVar12) {
          uVar24 = (s->br).bit_pos_;
          if (uVar24 < 0x21) {
            (s->br).val_ = (s->br).val_ | (ulong)*puVar11 << ((byte)uVar24 & 0x3f);
            (s->br).bit_pos_ = uVar24 + 0x20;
            (s->br).next_in = (uint8_t *)(puVar11 + 1);
          }
          uVar24 = (s->br).val_;
          uVar21 = (ulong)((uint)uVar24 & 0x1f);
          bVar4 = (byte)s->trivial_literal_contexts[uVar21 + 0x18];
          uVar29 = (s->br).bit_pos_ - (ulong)bVar4;
          uVar24 = uVar24 >> (bVar4 & 0x3f);
          (s->br).bit_pos_ = uVar29;
          (s->br).val_ = uVar24;
          uVar8 = *(ushort *)((long)s->trivial_literal_contexts + uVar21 * 4 + 0x62);
          uVar21 = (ulong)uVar8;
          if (uVar21 < 0x10) {
            if (uVar21 != 0) {
              puVar10[*(int *)((long)&s->arena + uVar21 * 4 + 0x668)] = (uint16_t)uVar16;
              *(int *)((long)&s->arena + uVar21 * 4 + 0x668) = (int)uVar16;
              uVar31 = uVar31 - (0x8000 >> ((byte)uVar8 & 0x1f));
              psVar3 = (short *)((long)&s->arena + uVar21 * 2 + 0x6fa);
              *psVar3 = *psVar3 + 1;
              local_40 = uVar21;
            }
            uVar33 = 0;
            uVar20 = uVar16 + 1;
          }
          else {
            uVar23 = (ulong)(uVar21 == 0x10) ^ 3;
            uVar21 = *(ulong *)(kBrotliBitMask + uVar23 * 8);
            (s->br).bit_pos_ = uVar29 - uVar23;
            (s->br).val_ = uVar24 >> (sbyte)uVar23;
            uVar27 = 0;
            if (uVar8 == 0x10) {
              uVar27 = local_40;
            }
            uVar29 = uVar33;
            if (uVar20 != uVar27) {
              uVar29 = 0;
            }
            uVar23 = uVar29 - 2 << (sbyte)uVar23 | 3;
            if (uVar29 == 0) {
              uVar23 = 3;
            }
            uVar33 = (uVar21 & uVar24) + uVar23;
            lVar22 = uVar33 - uVar29;
            uVar20 = lVar22 + uVar16;
            if (alphabet_size_limit < uVar20) {
              uVar31 = 0xfffff;
              uVar20 = alphabet_size_limit;
            }
            else if (uVar27 != 0) {
              iVar15 = *(int *)((long)&s->arena + uVar27 * 4 + 0x668);
              lVar32 = 0;
              uVar20 = uVar16;
              do {
                puVar10[iVar15] = (uint16_t)uVar20;
                iVar15 = (int)uVar20;
                uVar20 = uVar20 + 1;
                lVar32 = lVar32 + -1;
              } while ((uVar29 - uVar23) - (uVar21 & uVar24) != lVar32);
              *(uint *)((long)&s->arena + uVar27 * 4 + 0x668) = ~(uint)lVar32 + (int)uVar16;
              psVar3 = (short *)((long)&s->arena + uVar27 * 2 + 0x6fa);
              *psVar3 = *psVar3 + (short)lVar22;
              uVar31 = uVar31 - (lVar22 << (0xfU - (char)uVar27 & 0x3f));
            }
          }
        }
        else {
          (s->arena).header.symbol = uVar16;
          (s->arena).header.repeat = uVar33;
          (s->arena).header.prev_code_len = local_40;
          (s->arena).header.repeat_code_len = uVar20;
          (s->arena).header.space = uVar31;
          uVar20 = uVar16;
        }
        uVar16 = uVar20;
        uVar20 = uVar27;
      } while (puVar11 < puVar12);
    }
    bVar34 = true;
LAB_0032fcf3:
    if (bVar34) {
      uVar16 = (s->arena).header.symbol;
      BVar13 = BROTLI_DECODER_SUCCESS;
      if (uVar16 < alphabet_size_limit) {
        uVar33 = (s->arena).header.space;
        bVar34 = false;
        do {
          if (uVar33 == 0) break;
          if (bVar34) {
            pbVar30 = (s->br).next_in;
            if (pbVar30 != (s->br).last_in) {
              uVar31 = (s->br).bit_pos_;
              (s->br).val_ = (s->br).val_ | (ulong)*pbVar30 << ((byte)uVar31 & 0x3f);
              (s->br).bit_pos_ = uVar31 + 8;
              (s->br).next_in = pbVar30 + 1;
              goto LAB_0032fd62;
            }
            bVar26 = true;
            bVar34 = true;
          }
          else {
LAB_0032fd62:
            uVar20 = (s->br).bit_pos_;
            if (uVar20 == 0) {
              uVar27 = 0;
            }
            else {
              uVar27 = (ulong)(uint)br_00->val_;
            }
            uVar21 = (ulong)((uint)uVar27 & 0x1f);
            bVar4 = (byte)s->trivial_literal_contexts[uVar21 + 0x18];
            uVar24 = (ulong)bVar4;
            bVar34 = true;
            bVar26 = false;
            if (uVar24 <= uVar20) {
              uVar8 = *(ushort *)((long)s->trivial_literal_contexts + uVar21 * 4 + 0x62);
              uVar21 = (ulong)uVar8;
              if (uVar21 < 0x10) {
                (s->br).bit_pos_ = uVar20 - uVar24;
                (s->br).val_ = (s->br).val_ >> (bVar4 & 0x3f);
                (s->arena).header.repeat = 0;
                if (uVar21 != 0) {
                  (s->arena).header.symbol_lists[*(int *)((long)&s->arena + uVar21 * 4 + 0x668)] =
                       (uint16_t)uVar16;
                  *(int *)((long)&s->arena + uVar21 * 4 + 0x668) = (int)uVar16;
                  (s->arena).header.prev_code_len = uVar21;
                  uVar33 = uVar33 - (0x8000 >> ((byte)uVar8 & 0x1f));
                  (s->arena).header.space = uVar33;
                  psVar3 = (short *)((long)&s->arena + uVar21 * 2 + 0x6fa);
                  *psVar3 = *psVar3 + 1;
                }
                (s->arena).header.symbol = uVar16 + 1;
                bVar26 = false;
                bVar34 = false;
                uVar16 = uVar16 + 1;
              }
              else {
                uVar24 = (uVar21 + uVar24) - 0xe;
                if (uVar24 <= uVar20) {
                  uVar27 = (ulong)((uint)(uVar27 >> (bVar4 & 0x3f)) &
                                  *(uint *)("" + uVar21 * 8 + 0x90));
                  (s->br).bit_pos_ = uVar20 - uVar24;
                  (s->br).val_ = (s->br).val_ >> ((byte)uVar24 & 0x3f);
                  if (uVar21 == 0x10) {
                    uVar31 = (s->arena).header.prev_code_len;
                    sVar18 = 2;
                  }
                  else {
                    sVar18 = 3;
                    uVar31 = 0;
                  }
                  if ((s->arena).header.repeat_code_len != uVar31) {
                    (s->arena).header.repeat = 0;
                    (s->arena).header.repeat_code_len = uVar31;
                  }
                  uVar31 = (s->arena).header.repeat;
                  if (uVar31 != 0) {
                    (s->arena).header.repeat = uVar31 - 2 << sVar18;
                  }
                  puVar10 = (s->arena).header.symbol_lists;
                  uVar29 = (s->arena).header.repeat;
                  uVar25 = uVar27 + uVar29 + 3;
                  (s->arena).header.repeat = uVar25;
                  lVar22 = uVar25 - uVar31;
                  uVar20 = lVar22 + uVar16;
                  if (alphabet_size_limit < uVar20) {
                    (s->arena).header.symbol = alphabet_size_limit;
                    (s->arena).header.space = 0xfffff;
                    bVar26 = false;
                    uVar33 = 0xfffff;
                    bVar34 = false;
                    uVar16 = alphabet_size_limit;
                  }
                  else {
                    uVar25 = (s->arena).header.repeat_code_len;
                    if (uVar25 == 0) {
                      (s->arena).header.symbol = uVar20;
                    }
                    else {
                      iVar15 = *(int *)((long)&s->arena + uVar25 * 4 + 0x668);
                      lVar32 = 0;
                      uVar20 = uVar16;
                      do {
                        puVar10[iVar15] = (uint16_t)uVar20;
                        iVar15 = (int)uVar20;
                        uVar20 = uVar20 + 1;
                        lVar32 = lVar32 + -1;
                      } while (((uVar31 - uVar29) - uVar27) + -3 != lVar32);
                      (s->arena).header.symbol = uVar20;
                      *(uint *)((long)&s->arena + uVar25 * 4 + 0x668) = ~(uint)lVar32 + (int)uVar16;
                      uVar33 = uVar33 - (lVar22 << (0xfU - (char)uVar25 & 0x3f));
                      (s->arena).header.space = uVar33;
                      psVar3 = (short *)((long)&s->arena + uVar25 * 2 + 0x6fa);
                      *psVar3 = *psVar3 + (short)lVar22;
                    }
                    bVar26 = false;
                    bVar34 = false;
                    uVar16 = uVar20;
                  }
                }
              }
            }
          }
          if (bVar26) {
            BVar13 = BROTLI_DECODER_NEEDS_MORE_INPUT;
            break;
          }
        } while (uVar16 < alphabet_size_limit);
      }
    }
    if (BVar13 != BROTLI_DECODER_SUCCESS) {
      return BVar13;
    }
    if ((s->arena).header.space != 0) {
      return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
    }
    uVar14 = BrotliBuildHuffmanTable
                       (table,8,(s->arena).header.symbol_lists,(s->arena).header.code_length_histo);
    goto LAB_0032f9cf;
  }
  goto LAB_0032f929;
LAB_0032f8ba:
  do {
    if (uVar20 == uVar27) {
      uVar16 = 1;
      break;
    }
    uVar24 = uVar20 + 1;
    bVar34 = uVar27 < uVar24;
    uVar16 = alphabet_size_max;
    if (uVar24 <= uVar27) {
      sVar7 = *(short *)((long)&s->arena + uVar20 * 2 + 200);
      lVar32 = lVar22;
      if (sVar7 == *(short *)((long)&s->arena + uVar20 * 2 + 0xca)) {
        bVar34 = false;
        uVar16 = 0xfffffffb;
      }
      else {
        do {
          bVar34 = uVar27 < lVar32 - 0x20cU;
          uVar16 = alphabet_size_max;
          if (uVar27 < lVar32 - 0x20cU) break;
          lVar1 = lVar32 * 2;
          uVar16 = 0xfffffffb;
          lVar32 = lVar32 + 1;
        } while (sVar7 != *(short *)((long)s->dist_rb + lVar1 + -0x70));
      }
    }
    lVar22 = lVar22 + 1;
    uVar20 = uVar24;
    alphabet_size_max = uVar16;
  } while (bVar34);
LAB_0032f929:
  if ((BrotliDecoderErrorCode)uVar16 != BROTLI_DECODER_SUCCESS) {
    return (BrotliDecoderErrorCode)uVar16;
  }
LAB_0032f932:
  if ((s->arena).header.symbol == 3) {
    uVar33 = (s->br).bit_pos_;
    bVar34 = uVar33 == 0;
    if (bVar34) {
      pbVar30 = (s->br).next_in;
      if (pbVar30 != (s->br).last_in) {
        (s->br).val_ = (s->br).val_ | (ulong)*pbVar30;
        (s->br).bit_pos_ = 8;
        (s->br).next_in = pbVar30 + 1;
        uVar33 = 8;
        bVar34 = false;
        goto LAB_0032f976;
      }
    }
    else {
LAB_0032f976:
      uVar16 = (s->br).val_;
      alphabet_size_max = (uint64_t)((uint)uVar16 & 1);
      (s->br).bit_pos_ = uVar33 - 1;
      (s->br).val_ = uVar16 >> 1;
    }
    if (bVar34) {
      (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    (s->arena).header.symbol = alphabet_size_max + 3;
  }
  uVar14 = BrotliBuildSimpleHuffmanTable
                     (table,8,(s->arena).header.symbols_lists_array,
                      *(uint32_t *)((long)&s->arena + 0x28));
LAB_0032f9cf:
  if (opt_table_size != (uint64_t *)0x0) {
    *opt_table_size = (ulong)uVar14;
  }
  BVar13 = BROTLI_DECODER_SUCCESS;
  BVar19 = BROTLI_STATE_HUFFMAN_NONE;
LAB_0032f9e1:
  (s->arena).header.substate_huffman = BVar19;
  return BVar13;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(brotli_reg_t alphabet_size_max, brotli_reg_t alphabet_size_limit,
                                              HuffmanCode *table, brotli_reg_t *opt_table_size, BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;
	BrotliMetablockHeaderArena *h = &s->arena.header;
	/* State machine. */
	for (;;) {
		switch (h->substate_huffman) {
		case BROTLI_STATE_HUFFMAN_NONE:
			if (!BrotliSafeReadBits(br, 2, &h->sub_loop_counter)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			BROTLI_LOG_UINT(h->sub_loop_counter);
			/* The value is used as follows:
			   1 for simple code;
			   0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
			if (h->sub_loop_counter != 1) {
				h->space = 32;
				h->repeat = 0; /* num_codes */
				memset(&h->code_length_histo[0], 0,
				       sizeof(h->code_length_histo[0]) * (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
				memset(&h->code_length_code_lengths[0], 0, sizeof(h->code_length_code_lengths));
				h->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
				continue;
			}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
			/* Read symbols, codes & code lengths directly. */
			if (!BrotliSafeReadBits(br, 2, &h->symbol)) { /* num_symbols */
				h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			h->sub_loop_counter = 0;
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
			BrotliDecoderErrorCode result = ReadSimpleHuffmanSymbols(alphabet_size_max, alphabet_size_limit, s);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
		}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
			brotli_reg_t table_size;
			if (h->symbol == 3) {
				brotli_reg_t bits;
				if (!BrotliSafeReadBits(br, 1, &bits)) {
					h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				h->symbol += bits;
			}
			BROTLI_LOG_UINT(h->symbol);
			table_size =
			    BrotliBuildSimpleHuffmanTable(table, HUFFMAN_TABLE_BITS, h->symbols_lists_array, (uint32_t)h->symbol);
			if (opt_table_size) {
				*opt_table_size = table_size;
			}
			h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
			return BROTLI_DECODER_SUCCESS;
		}

		/* Decode Huffman-coded code lengths. */
		case BROTLI_STATE_HUFFMAN_COMPLEX: {
			brotli_reg_t i;
			BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
			BrotliBuildCodeLengthsHuffmanTable(h->table, h->code_length_code_lengths, h->code_length_histo);
			memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo));
			for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
				h->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
				h->symbol_lists[h->next_symbol[i]] = 0xFFFF;
			}

			h->symbol = 0;
			h->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
			h->repeat = 0;
			h->repeat_code_len = 0;
			h->space = 32768;
			h->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
		}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
			brotli_reg_t table_size;
			BrotliDecoderErrorCode result = ReadSymbolCodeLengths(alphabet_size_limit, s);
			if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
				result = SafeReadSymbolCodeLengths(alphabet_size_limit, s);
			}
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}

			if (h->space != 0) {
				BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", (int)h->space));
				return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
			}
			table_size = BrotliBuildHuffmanTable(table, HUFFMAN_TABLE_BITS, h->symbol_lists, h->code_length_histo);
			if (opt_table_size) {
				*opt_table_size = table_size;
			}
			h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
			return BROTLI_DECODER_SUCCESS;
		}

		default:
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
		}
	}
}